

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5ApiPhraseFirstColumn(Fts5Context *pCtx,int iPhrase,Fts5PhraseIter *pIter,int *piCol)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  undefined8 in_RAX;
  uchar *puVar4;
  int n;
  undefined8 local_28;
  
  local_28 = in_RAX;
  if (*(int *)(*(long *)(*(long *)pCtx + 0x18) + 0x5c) == 2) {
    lVar1 = *(long *)(pCtx + 0x48);
    if (lVar1 == 0) {
      iVar3 = sqlite3Fts5ExprPhraseCollist
                        (*(Fts5Expr **)(pCtx + 0x40),iPhrase,&pIter->a,(int *)((long)&local_28 + 4))
      ;
      if (iVar3 != 0) {
        return iVar3;
      }
      puVar4 = pIter->a;
    }
    else {
      if (iPhrase == 0) {
        iVar3 = 0;
      }
      else {
        iVar3 = *(int *)(lVar1 + 0x18 + (long)iPhrase * 4);
      }
      local_28._4_4_ = *(int *)(lVar1 + 0x1c + (long)iPhrase * 4) - iVar3;
      puVar4 = (uchar *)((long)iVar3 + *(long *)(lVar1 + 0x10));
      pIter->a = puVar4;
    }
    pIter->b = puVar4 + local_28._4_4_;
    *piCol = 0;
    fts5ApiPhraseNextColumn(pCtx,pIter,piCol);
    iVar3 = 0;
  }
  else {
    iVar3 = fts5CsrPoslist((Fts5Cursor *)pCtx,iPhrase,&pIter->a,(int *)&local_28);
    if (iVar3 == 0) {
      puVar4 = pIter->a;
      pIter->b = puVar4 + (int)local_28;
      if ((long)(int)local_28 < 1) {
        *piCol = -1;
      }
      else if (*puVar4 == '\x01') {
        uVar2 = sqlite3Fts5GetVarint32(puVar4 + 1,(u32 *)piCol);
        pIter->a = pIter->a + (ulong)uVar2 + 1;
      }
      else {
        *piCol = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

static int fts5ApiPhraseFirstColumn(
  Fts5Context *pCtx, 
  int iPhrase, 
  Fts5PhraseIter *pIter, 
  int *piCol
){
  int rc = SQLITE_OK;
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5Config *pConfig = ((Fts5Table*)(pCsr->base.pVtab))->pConfig;

  if( pConfig->eDetail==FTS5_DETAIL_COLUMNS ){
    Fts5Sorter *pSorter = pCsr->pSorter;
    int n;
    if( pSorter ){
      int i1 = (iPhrase==0 ? 0 : pSorter->aIdx[iPhrase-1]);
      n = pSorter->aIdx[iPhrase] - i1;
      pIter->a = &pSorter->aPoslist[i1];
    }else{
      rc = sqlite3Fts5ExprPhraseCollist(pCsr->pExpr, iPhrase, &pIter->a, &n);
    }
    if( rc==SQLITE_OK ){
      pIter->b = &pIter->a[n];
      *piCol = 0;
      fts5ApiPhraseNextColumn(pCtx, pIter, piCol);
    }
  }else{
    int n;
    rc = fts5CsrPoslist(pCsr, iPhrase, &pIter->a, &n);
    if( rc==SQLITE_OK ){
      pIter->b = &pIter->a[n];
      if( n<=0 ){
        *piCol = -1;
      }else if( pIter->a[0]==0x01 ){
        pIter->a += 1 + fts5GetVarint32(&pIter->a[1], *piCol);
      }else{
        *piCol = 0;
      }
    }
  }

  return rc;
}